

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O1

int big_file_mpi_broadcast_anyerror(int rt,MPI_Comm comm)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  int root;
  int rank;
  int errorlen;
  int loc;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = rt;
  MPI_Comm_rank(comm,&local_28);
  local_20 = 0;
  if (local_1c != 0) {
    local_20 = local_28 + 1;
  }
  MPI_Allreduce(&local_20,&local_2c,1,&ompi_mpi_int,&ompi_mpi_op_max,comm);
  if (local_2c == 0) {
    local_1c = 0;
  }
  else {
    local_2c = local_2c + -1;
    __s = big_file_get_error_message();
    iVar1 = local_2c;
    if (local_28 == local_2c) {
      sVar2 = strlen(__s);
      local_24 = (int)sVar2;
    }
    MPI_Bcast(&local_24,1,&ompi_mpi_int,iVar1,comm);
    iVar1 = local_2c;
    if (local_28 != local_2c) {
      __s = (char *)malloc((long)local_24 + 1);
    }
    MPI_Bcast(__s,local_24 + 1,&ompi_mpi_byte,iVar1,comm);
    if (local_28 != local_2c) {
      big_file_set_error_message(__s);
      free(__s);
    }
    MPI_Bcast(&local_1c,1,&ompi_mpi_int,local_2c,comm);
  }
  return local_1c;
}

Assistant:

static int
big_file_mpi_broadcast_anyerror(int rt, MPI_Comm comm)
{
    int rank;
    MPI_Comm_rank(comm, &rank);
    int root, loc = 0;
    /* Add 1 so we do not swallow errors on rank 0*/
    if(rt != 0)
        loc = rank+1;

    MPI_Allreduce(&loc, &root, 1, MPI_INT, MPI_MAX, comm);

    if (root == 0) {
        /* no errors */
        return 0;
    }

    root -= 1;
    char * error = big_file_get_error_message();

    int errorlen;
    if(rank == root) {
        errorlen = strlen(error);
    }
    MPI_Bcast(&errorlen, 1, MPI_INT, root, comm);

    if(rank != root) {
        error = malloc(errorlen + 1);
    }

    MPI_Bcast(error, errorlen + 1, MPI_BYTE, root, comm);

    if(rank != root) {
        big_file_set_error_message(error);
        free(error);
    }

    MPI_Bcast(&rt, 1, MPI_INT, root, comm);

    return rt;
}